

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

float __thiscall nv::KaiserFilter::evaluate(KaiserFilter *this,float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = anon_unknown.dwarf_4c8503::sincf(x * 3.1415927 * this->stretch);
  fVar2 = x / (this->super_Filter).m_width;
  fVar2 = 1.0 - fVar2 * fVar2;
  fVar3 = 0.0;
  if (0.0 <= fVar2) {
    fVar3 = *(float *)&(this->super_Filter).field_0xc;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar2 = anon_unknown.dwarf_4c8503::bessel0(fVar3 * fVar2);
    fVar3 = anon_unknown.dwarf_4c8503::bessel0(*(float *)&(this->super_Filter).field_0xc);
    fVar3 = (fVar1 * fVar2) / fVar3;
  }
  return fVar3;
}

Assistant:

float KaiserFilter::evaluate(float x) const
{
	const float sinc_value = sincf(PI * x * stretch);
	const float t = x / m_width;
	if ((1 - t * t) >= 0) return sinc_value * bessel0(alpha * sqrtf(1 - t * t)) / bessel0(alpha);
	else return 0;
}